

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShellIntrinsics.cpp
# Opt level: O2

IntrinsicResult intrinsic_feof(Context *context,IntrinsicResult partialResult)

{
  int iVar1;
  Value fileWrapper;
  Value local_58;
  Value local_48;
  Value self;
  String local_28;
  
  MiniScript::String::String(&local_28,"self");
  MiniScript::Context::GetVar((Context *)&self,(String *)partialResult.rs,(LocalOnlyMode)&local_28);
  MiniScript::String::release(&local_28);
  MiniScript::Value::Value(&local_48,&_handle);
  MiniScript::Value::Lookup(&fileWrapper,&self);
  MiniScript::Value::~Value(&local_48);
  if (fileWrapper.type == Handle) {
    if ((FILE *)fileWrapper.data.ref[1]._vptr_RefCountedStorage == (FILE *)0x0) {
      MiniScript::IntrinsicResult::IntrinsicResult
                ((IntrinsicResult *)context,(IntrinsicResult *)&MiniScript::IntrinsicResult::Null);
    }
    else {
      iVar1 = feof((FILE *)fileWrapper.data.ref[1]._vptr_RefCountedStorage);
      MiniScript::Value::Truth(&local_58,iVar1 != 0);
      MiniScript::IntrinsicResult::IntrinsicResult((IntrinsicResult *)context,&local_58,true);
      MiniScript::Value::~Value(&local_58);
    }
  }
  else {
    MiniScript::IntrinsicResult::IntrinsicResult
              ((IntrinsicResult *)context,(IntrinsicResult *)&MiniScript::IntrinsicResult::Null);
  }
  MiniScript::Value::~Value(&fileWrapper);
  MiniScript::Value::~Value(&self);
  return (IntrinsicResult)(IntrinsicResultStorage *)context;
}

Assistant:

static IntrinsicResult intrinsic_feof(Context *context, IntrinsicResult partialResult) {
	Value self = context->GetVar("self");
	
	Value fileWrapper = self.Lookup(_handle);
	if (fileWrapper.IsNull() or fileWrapper.type != ValueType::Handle) return IntrinsicResult::Null;
	FileHandleStorage *storage = (FileHandleStorage*)fileWrapper.data.ref;
	FILE *handle = storage->f;
	if (handle == nullptr) return IntrinsicResult::Null;

	// Note: feof returns true only after attempting to read PAST the end of the file.
	// Not after the last successful read.  See: https://stackoverflow.com/questions/34888776
	return IntrinsicResult(Value::Truth(feof(handle) != 0));
}